

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderMaxCombinedTextureUnitsTest::GeometryShaderMaxCombinedTextureUnitsTest
          (GeometryShaderMaxCombinedTextureUnitsTest *this,Context *context,ExtParameters *extParams
          ,char *name,char *description)

{
  GeometryShaderLimitsRenderingBase::GeometryShaderLimitsRenderingBase
            (&this->super_GeometryShaderLimitsRenderingBase,context,extParams,name,description);
  (this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__GeometryShaderMaxCombinedTextureUnitsTest_01e004c8;
  this->m_texture_width = 0;
  this->m_max_combined_texture_units = 0;
  this->m_max_fragment_texture_units = 0;
  this->m_max_geometry_texture_units = 0;
  this->m_max_vertex_texture_units = 0;
  this->m_min_texture_units = 0;
  this->m_n_fragment_texture_units = 0;
  this->m_n_geometry_texture_units = 0;
  this->m_n_texture_units = 0;
  this->m_n_vertex_texture_units = 0;
  (this->m_n_fragment_texture_units_string)._M_dataplus._M_p =
       (pointer)&(this->m_n_fragment_texture_units_string).field_2;
  (this->m_n_fragment_texture_units_string)._M_string_length = 0;
  (this->m_n_fragment_texture_units_string).field_2._M_local_buf[0] = '\0';
  (this->m_n_geometry_texture_units_string)._M_dataplus._M_p =
       (pointer)&(this->m_n_geometry_texture_units_string).field_2;
  (this->m_n_geometry_texture_units_string)._M_string_length = 0;
  (this->m_n_geometry_texture_units_string).field_2._M_local_buf[0] = '\0';
  (this->m_n_vertex_texture_units_string)._M_dataplus._M_p =
       (pointer)&(this->m_n_vertex_texture_units_string).field_2;
  (this->m_n_vertex_texture_units_string)._M_string_length = 0;
  (this->m_n_vertex_texture_units_string).field_2._M_local_buf[0] = '\0';
  (this->m_textures).
  super__Vector_base<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_textures).
  super__Vector_base<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_textures).
  super__Vector_base<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

GeometryShaderMaxCombinedTextureUnitsTest::GeometryShaderMaxCombinedTextureUnitsTest(Context&			  context,
																					 const ExtParameters& extParams,
																					 const char*		  name,
																					 const char*		  description)
	: GeometryShaderLimitsRenderingBase(context, extParams, name, description)
	, m_texture_width(0)
	, m_max_combined_texture_units(0)
	, m_max_fragment_texture_units(0)
	, m_max_geometry_texture_units(0)
	, m_max_vertex_texture_units(0)
	, m_min_texture_units(0)
	, m_n_fragment_texture_units(0)
	, m_n_geometry_texture_units(0)
	, m_n_texture_units(0)
	, m_n_vertex_texture_units(0)
{
	/* Nothing to be done here */
}